

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
       *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  iterator __x;
  mapped_type *this_00;
  iterator __begin0;
  key_type_conflict local_51;
  iterator local_50;
  
  pvVar1 = (this->source).source.source;
  (this->source).source.current._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->source).source.end._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>::begin
            (&local_50,&this->source);
  while (__x._M_current = local_50.source.current._M_current, (local_50.valid & 1U) != 0) {
    local_51 = std::function<bool_(const_int_&)>::operator()
                         (&this->transformer,local_50.source.current._M_current);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_51);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,__x._M_current);
    local_50.source.current._M_current = local_50.source.current._M_current + 1;
    local_50.valid = local_50.source.current._M_current != local_50.source.end._M_current;
  }
  (this->current)._M_node = (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}